

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

Spline * createFlatOffsetSpline(SplineStack *ss,float f,float g,float h,float i,float j,float k)

{
  int iVar1;
  Spline *rsp;
  Spline *pSVar2;
  SplineStack *in_RDI;
  float in_XMM0_Da;
  float der;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float m;
  float l;
  Spline *sp;
  float local_4c;
  float local_2c;
  
  iVar1 = in_RDI->len;
  in_RDI->len = iVar1 + 1;
  rsp = in_RDI->stack + iVar1;
  rsp->typ = 2;
  local_2c = (in_XMM1_Da - in_XMM0_Da) * 0.5;
  if (local_2c < in_XMM5_Da) {
    local_2c = in_XMM5_Da;
  }
  der = (in_XMM2_Da - in_XMM1_Da) * 5.0;
  pSVar2 = createFixSpline(in_RDI,in_XMM0_Da);
  addSplineVal(rsp,-1.0,pSVar2,local_2c);
  pSVar2 = createFixSpline(in_RDI,in_XMM1_Da);
  local_4c = der;
  if (local_2c < der) {
    local_4c = local_2c;
  }
  addSplineVal(rsp,-0.4,pSVar2,local_4c);
  pSVar2 = createFixSpline(in_RDI,in_XMM2_Da);
  addSplineVal(rsp,0.0,pSVar2,der);
  pSVar2 = createFixSpline(in_RDI,in_XMM3_Da);
  addSplineVal(rsp,0.4,pSVar2,(in_XMM3_Da - in_XMM2_Da) * 2.0);
  pSVar2 = createFixSpline(in_RDI,in_XMM4_Da);
  addSplineVal(rsp,1.0,pSVar2,(in_XMM4_Da - in_XMM3_Da) * 0.7);
  return rsp;
}

Assistant:

static Spline *createFlatOffsetSpline(
    SplineStack *ss, float f, float g, float h, float i, float j, float k)
{
    Spline *sp = &ss->stack[ss->len++];
    sp->typ = SP_RIDGES;

    float l = 0.5F * (g - f); if (l < k) l = k;
    float m = 5.0F * (h - g);

    addSplineVal(sp, -1.0F, createFixSpline(ss, f), l);
    addSplineVal(sp, -0.4F, createFixSpline(ss, g), l < m ? l : m);
    addSplineVal(sp,  0.0F, createFixSpline(ss, h), m);
    addSplineVal(sp,  0.4F, createFixSpline(ss, i), 2.0F*(i-h));
    addSplineVal(sp,  1.0F, createFixSpline(ss, j), 0.7F*(j-i));

    return sp;
}